

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O1

void __thiscall ImGuiTextBuffer::ImGuiTextBuffer(ImGuiTextBuffer *this)

{
  int *piVar1;
  int iVar2;
  char *pcVar3;
  ImGuiContext *pIVar4;
  char *__dest;
  
  (this->Buf).Size = 0;
  (this->Buf).Capacity = 0;
  (this->Buf).Data = (char *)0x0;
  pIVar4 = GImGui;
  if ((this->Buf).Capacity == 0) {
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + 1;
    __dest = (char *)(*(pIVar4->IO).MemAllocFn)(8);
    pcVar3 = (this->Buf).Data;
    if (pcVar3 != (char *)0x0) {
      memcpy(__dest,pcVar3,(long)(this->Buf).Size);
    }
    pcVar3 = (this->Buf).Data;
    if (pcVar3 != (char *)0x0) {
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
    }
    (*(GImGui->IO).MemFreeFn)(pcVar3);
    (this->Buf).Data = __dest;
    (this->Buf).Capacity = 8;
  }
  iVar2 = (this->Buf).Size;
  (this->Buf).Size = iVar2 + 1;
  (this->Buf).Data[iVar2] = '\0';
  return;
}

Assistant:

ImGuiTextBuffer()   { Buf.push_back(0); }